

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * columnName(sqlite3_stmt *pStmt,int N,_func_void_ptr_Mem_ptr *xFunc,int useType)

{
  long lVar1;
  int iVar2;
  sqlite3 *db;
  int n;
  Vdbe *p;
  void *ret;
  int useType_local;
  _func_void_ptr_Mem_ptr *xFunc_local;
  int N_local;
  sqlite3_stmt *pStmt_local;
  
  p = (Vdbe *)0x0;
  lVar1 = *(long *)pStmt;
  iVar2 = sqlite3_column_count(pStmt);
  if ((N < iVar2) && (-1 < N)) {
    sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar1 + 0x18));
    p = (Vdbe *)(*xFunc)((Mem *)(*(long *)(pStmt + 0x20) + (long)(useType * iVar2 + N) * 0x38));
    if (*(char *)(lVar1 + 0x50) != '\0') {
      *(undefined1 *)(lVar1 + 0x50) = 0;
      p = (Vdbe *)0x0;
    }
    sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar1 + 0x18));
  }
  return p;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,
  int N,
  const void *(*xFunc)(Mem*),
  int useType
){
  const void *ret = 0;
  Vdbe *p = (Vdbe *)pStmt;
  int n;
  sqlite3 *db = p->db;
  
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
    ret = xFunc(&p->aColName[N]);
     /* A malloc may have failed inside of the xFunc() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      db->mallocFailed = 0;
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}